

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderPrimitiveCounterRestartingPrimitive::setUpVertexAttributeArrays
          (GeometryShaderPrimitiveCounterRestartingPrimitive *this)

{
  ulong __n;
  GLuint GVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *__s;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar5;
  
  iVar2 = (*((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  uVar14 = (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
           m_numberOfVerticesPerOneInputPrimitive *
           (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
           m_numberOfDrawnPrimitives + this->m_numberOfRestarts;
  uVar3 = (*((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[2])();
  iVar2 = 0;
  uVar8 = -(uint)((uVar3 & 0x300) == 0) | uVar14;
  uVar7 = 1;
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_bo_id);
  (**(code **)(lVar5 + 0x40))(0x8893,this->m_bo_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not generate a buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x3f2);
  __n = (ulong)uVar14 * 4;
  __s = operator_new__(__n);
  memset(__s,0,__n);
  uVar3 = this->m_numberOfRestarts;
  if ((ulong)uVar3 != 0) {
    GVar1 = (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
            m_numberOfVerticesPerOneInputPrimitive;
    uVar10 = 0;
    do {
      iVar9 = (int)uVar10;
      iVar6 = (int)uVar7;
      if (GVar1 * iVar9 + 1 < uVar14) {
        uVar11 = (ulong)((iVar9 + 1) * GVar1 + iVar9);
        iVar12 = iVar2;
        do {
          if (uVar7 < uVar11) {
            iVar13 = (int)uVar7;
LAB_00d1b5f2:
            *(int *)((long)__s + uVar7 * 4) = iVar13 - iVar9;
          }
          else {
            iVar13 = iVar12;
            if (uVar11 < uVar7) goto LAB_00d1b5f2;
          }
          uVar7 = uVar7 + 1;
          iVar12 = iVar12 + 1;
        } while (uVar7 < uVar14);
      }
      uVar10 = uVar10 + 1;
      *(uint *)((long)__s + (ulong)(iVar9 + GVar1 * (int)uVar10) * 4) = uVar8;
      uVar7 = (ulong)(iVar6 + GVar1);
      iVar2 = iVar2 + GVar1;
    } while (uVar10 != uVar3);
  }
  (**(code **)(lVar5 + 0x150))(0x8893,__n,__s,0x88e4);
  operator_delete__(__s);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not create element array buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x418);
  uVar3 = (*((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[2])();
  if ((uVar3 & 0x300) != 0) {
    (**(code **)(lVar5 + 0x1048))(uVar8);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not set primitive restart index",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x41e);
    return;
  }
  return;
}

Assistant:

void GeometryShaderPrimitiveCounterRestartingPrimitive::setUpVertexAttributeArrays()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a buffer object to hold the element data */
	glw::GLuint*	   indices = DE_NULL;
	const unsigned int nIndices =
		m_testConfiguration.m_numberOfDrawnPrimitives * m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive +
		m_numberOfRestarts;
	unsigned int restartIndex;
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		restartIndex = nIndices;
	}
	else
	{
		restartIndex = 0xFFFFFFFF;
	}

	gl.genBuffers(1, &m_bo_id);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate a buffer object");

	/* Prepare the data we will later use for configuring buffer object storage contents */
	indices = new unsigned int[nIndices];
	memset(indices, 0, nIndices * sizeof(unsigned int));

	for (unsigned int restartNr = 0; restartNr < m_numberOfRestarts; ++restartNr)
	{
		for (unsigned int i = m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * restartNr + 1; i < nIndices;
			 i++)
		{
			if (i < m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * (restartNr + 1) + restartNr)
			{
				indices[i] = i - restartNr;
			}
			else if (i > m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * (restartNr + 1) + restartNr)
			{
				indices[i] = (i - 1 - restartNr);
			}
		}
		indices[m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * (restartNr + 1) + restartNr] =
			restartIndex;
	}

	/*
	 m_testCtx.getLog() << tcu::TestLog::Message << "Indices table [ " << tcu::TestLog::EndMessage;
	 for (unsigned int i = 0; i < nIndices; i++)
	 {
	 m_testCtx.getLog() << tcu::TestLog::Message << indices[i] << ", " << tcu::TestLog::EndMessage;
	 }
	 m_testCtx.getLog() << tcu::TestLog::Message << " ]" << tcu::TestLog::EndMessage;
	 */

	/* Set up buffer object data storage */
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(glw::GLuint) * nIndices, indices, GL_STATIC_DRAW);
	/* Free the buffer we no longer need */
	delete[] indices;
	indices = NULL;
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create element array buffer object");

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Set up primitive restarting */
		gl.primitiveRestartIndex(restartIndex);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set primitive restart index");
	}
}